

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateReplayer::Impl::parse_compute_pipeline
          (Impl *this,StateCreatorInterface *iface,DatabaseInterface *resolver,Value *pipelines,
          Value *member)

{
  pointer __n;
  iterator iVar1;
  VkComputePipelineCreateInfo *pVVar2;
  Value *pVVar3;
  DatabaseInterface *pDVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  VkShaderStageFlagBits VVar8;
  SizeType SVar9;
  Ch *pCVar10;
  size_type sVar11;
  VkComputePipelineCreateInfo *pVVar12;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *this_00;
  Type pGVar13;
  VkPipelineCreateFlags2KHR VVar14;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *this_01;
  ulong uVar15;
  uchar *puVar16;
  size_type total_size;
  pointer ppVar17;
  VkShaderModule_T *pVVar18;
  char *pcVar19;
  mapped_type *ppVVar20;
  _Node_iterator_base<std::pair<const_unsigned_long,_VkShaderModule_T_*>,_false> local_b0;
  _Node_iterator_base<std::pair<const_unsigned_long,_VkShaderModule_T_*>,_false> local_a8;
  int local_a0;
  allocator<unsigned_char> local_99;
  undefined1 local_98 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> external_state;
  size_t external_state_size;
  _Node_iterator_base<std::pair<const_unsigned_long,_VkShaderModule_T_*>,_false> local_70;
  iterator module_iter;
  uint64_t module;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *stage;
  VkComputePipelineCreateInfo *info;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> *obj
  ;
  VkComputePipelineCreateInfo *info_allocated;
  Hash hash;
  Value *member_local;
  Value *pipelines_local;
  DatabaseInterface *resolver_local;
  StateCreatorInterface *iface_local;
  Impl *this_local;
  
  hash = (Hash)member;
  member_local = pipelines;
  pipelines_local = (Value *)resolver;
  resolver_local = (DatabaseInterface *)iface;
  iface_local = (StateCreatorInterface *)this;
  pCVar10 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetString(member);
  info_allocated = (VkComputePipelineCreateInfo *)string_to_uint64(pCVar10);
  sVar11 = std::
           unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
           ::count(&this->replayed_compute_pipelines,(key_type *)&info_allocated);
  if (sVar11 == 0) {
    pVVar12 = ScratchAllocator::allocate_cleared<VkComputePipelineCreateInfo>(&this->allocator);
    this_00 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               *)rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)member_local,
                            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             *)hash);
    pVVar12->sType = VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO;
    pGVar13 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ::operator[]<char_const>(this_00,"flags");
    uVar6 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetUint(pGVar13);
    pVVar12->flags = uVar6;
    pGVar13 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ::operator[]<char_const>(this_00,"basePipelineIndex");
    iVar7 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetInt(pGVar13);
    pVVar12->basePipelineIndex = iVar7;
    VVar14 = normalize_pipeline_creation_flags((ulong)pVVar12->flags);
    pDVar4 = resolver_local;
    pVVar3 = pipelines_local;
    pVVar12->flags = (VkPipelineCreateFlags)VVar14;
    pGVar13 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ::operator[]<char_const>(this_00,"basePipelineHandle");
    bVar5 = parse_derived_pipeline_handle
                      (this,(StateCreatorInterface *)pDVar4,(DatabaseInterface *)pVVar3,pGVar13,
                       member_local,RESOURCE_COMPUTE_PIPELINE,&pVVar12->basePipelineHandle);
    if (bVar5) {
      pGVar13 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                ::operator[]<char_const>(this_00,"layout");
      bVar5 = parse_pipeline_layout_handle(this,pGVar13,&pVVar12->layout);
      if (bVar5) {
        this_01 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   *)rapidjson::
                     GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                     ::operator[]<char_const>(this_00,"stage");
        (pVVar12->stage).sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
        pGVar13 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  ::operator[]<char_const>(this_01,"stage");
        VVar8 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::GetUint(pGVar13);
        (pVVar12->stage).stage = VVar8;
        pGVar13 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  ::operator[]<char_const>(this_01,"flags");
        uVar6 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::GetUint(pGVar13);
        (pVVar12->stage).flags = uVar6;
        bVar5 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             *)this_01,"pNext");
        if (bVar5) {
          pGVar13 = rapidjson::
                    GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                    ::operator[]<char_const>(this_01,"pNext");
          bVar5 = parse_pnext_chain(this,pGVar13,&(pVVar12->stage).pNext,
                                    (StateCreatorInterface *)0x0,(DatabaseInterface *)0x0,
                                    (Value *)0x0);
          if (!bVar5) {
            this_local._7_1_ = 0;
            goto LAB_00115966;
          }
        }
        pGVar13 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  ::operator[]<char_const>(this_01,"module");
        pCVar10 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::GetString(pGVar13);
        module_iter.
        super__Node_iterator_base<std::pair<const_unsigned_long,_VkShaderModule_T_*>,_false>._M_cur
             = (_Node_iterator_base<std::pair<const_unsigned_long,_VkShaderModule_T_*>,_false>)
               string_to_uint64(pCVar10);
        if ((module_iter.
             super__Node_iterator_base<std::pair<const_unsigned_long,_VkShaderModule_T_*>,_false>.
             _M_cur == (__node_type *)0x0) || ((this->resolve_shader_modules & 1U) == 0)) {
          pVVar18 = api_object_cast<VkShaderModule_T*,unsigned_long>
                              ((unsigned_long)
                               module_iter.
                               super__Node_iterator_base<std::pair<const_unsigned_long,_VkShaderModule_T_*>,_false>
                               ._M_cur);
          (pVVar12->stage).module = pVVar18;
        }
        else {
          local_70._M_cur =
               (__node_type *)
               std::
               unordered_map<unsigned_long,_VkShaderModule_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkShaderModule_T_*>_>_>
               ::find(&this->replayed_shader_modules,(key_type *)&module_iter);
          external_state_size =
               (size_t)std::
                       unordered_map<unsigned_long,_VkShaderModule_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkShaderModule_T_*>_>_>
                       ::end(&this->replayed_shader_modules);
          bVar5 = std::__detail::operator==
                            (&local_70,
                             (_Node_iterator_base<std::pair<const_unsigned_long,_VkShaderModule_T_*>,_false>
                              *)&external_state_size);
          if (bVar5) {
            external_state.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            if ((pipelines_local == (Value *)0x0) ||
               (uVar15 = (**(code **)((pipelines_local->data_).n.i64 + 0x18))
                                   (pipelines_local,4,
                                    module_iter.
                                    super__Node_iterator_base<std::pair<const_unsigned_long,_VkShaderModule_T_*>,_false>
                                    ._M_cur,&external_state.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage,0,0)
               , __n = external_state.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage, (uVar15 & 1) == 0)) {
              log_missing_resource
                        ("Shader module",
                         (Hash)module_iter.
                               super__Node_iterator_base<std::pair<const_unsigned_long,_VkShaderModule_T_*>,_false>
                               ._M_cur);
              this_local._7_1_ = 0;
              goto LAB_00115966;
            }
            std::allocator<unsigned_char>::allocator(&local_99);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_98,
                       (size_type)__n,&local_99);
            std::allocator<unsigned_char>::~allocator(&local_99);
            pVVar3 = pipelines_local;
            iVar1 = module_iter;
            puVar16 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_98);
            uVar15 = (**(code **)((pVVar3->data_).n.i64 + 0x18))
                               (pVVar3,4,iVar1.
                                         super__Node_iterator_base<std::pair<const_unsigned_long,_VkShaderModule_T_*>,_false>
                                         ._M_cur,
                                &external_state.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,puVar16,0);
            pDVar4 = resolver_local;
            pVVar3 = pipelines_local;
            if ((uVar15 & 1) == 0) {
              log_missing_resource
                        ("Shader module",
                         (Hash)module_iter.
                               super__Node_iterator_base<std::pair<const_unsigned_long,_VkShaderModule_T_*>,_false>
                               ._M_cur);
              this_local._7_1_ = 0;
              local_a0 = 1;
            }
            else {
              puVar16 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_98
                                  );
              total_size = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      local_98);
              bVar5 = parse(this,(StateCreatorInterface *)pDVar4,(DatabaseInterface *)pVVar3,puVar16
                            ,total_size);
              if (bVar5) {
                (*resolver_local->_vptr_DatabaseInterface[0xf])();
                local_a8._M_cur =
                     (__node_type *)
                     std::
                     unordered_map<unsigned_long,_VkShaderModule_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkShaderModule_T_*>_>_>
                     ::find(&this->replayed_shader_modules,(key_type *)&module_iter);
                local_70._M_cur = local_a8._M_cur;
                local_b0._M_cur =
                     (__node_type *)
                     std::
                     unordered_map<unsigned_long,_VkShaderModule_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkShaderModule_T_*>_>_>
                     ::end(&this->replayed_shader_modules);
                bVar5 = std::__detail::operator==(&local_70,&local_b0);
                if (bVar5) {
                  log_missing_resource
                            ("Shader module",
                             (Hash)module_iter.
                                   super__Node_iterator_base<std::pair<const_unsigned_long,_VkShaderModule_T_*>,_false>
                                   ._M_cur);
                  this_local._7_1_ = 0;
                  local_a0 = 1;
                }
                else {
                  local_a0 = 0;
                }
              }
              else {
                this_local._7_1_ = 0;
                local_a0 = 1;
              }
            }
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_98);
            if (local_a0 != 0) goto LAB_00115966;
          }
          else {
            (*resolver_local->_vptr_DatabaseInterface[0xf])();
          }
          ppVar17 = std::__detail::
                    _Node_iterator<std::pair<const_unsigned_long,_VkShaderModule_T_*>,_false,_false>
                    ::operator->((_Node_iterator<std::pair<const_unsigned_long,_VkShaderModule_T_*>,_false,_false>
                                  *)&local_70);
          (pVVar12->stage).module = ppVar17->second;
        }
        pGVar13 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  ::operator[]<char_const>(this_01,"name");
        pCVar10 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::GetString(pGVar13);
        pGVar13 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  ::operator[]<char_const>(this_01,"name");
        SVar9 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::GetStringLength(pGVar13);
        pcVar19 = duplicate_string(this,pCVar10,(ulong)SVar9);
        (pVVar12->stage).pName = pcVar19;
        bVar5 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             *)this_01,"specializationInfo");
        if (bVar5) {
          pGVar13 = rapidjson::
                    GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                    ::operator[]<char_const>(this_01,"specializationInfo");
          bVar5 = parse_specialization_info(this,pGVar13,&(pVVar12->stage).pSpecializationInfo);
          if (!bVar5) {
            this_local._7_1_ = 0;
            goto LAB_00115966;
          }
        }
        bVar5 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                             *)this_00,"pNext");
        if (bVar5) {
          pGVar13 = rapidjson::
                    GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                    ::operator[]<char_const>(this_00,"pNext");
          bVar5 = parse_pnext_chain(this,pGVar13,&pVVar12->pNext,(StateCreatorInterface *)0x0,
                                    (DatabaseInterface *)0x0,(Value *)0x0);
          if (!bVar5) {
            this_local._7_1_ = 0;
            goto LAB_00115966;
          }
        }
        pDVar4 = resolver_local;
        pVVar2 = info_allocated;
        ppVVar20 = std::
                   unordered_map<unsigned_long,_VkPipeline_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>_>
                   ::operator[](&this->replayed_compute_pipelines,(key_type *)&info_allocated);
        uVar6 = (*pDVar4->_vptr_DatabaseInterface[0xb])(pDVar4,pVVar2,pVVar12,ppVVar20);
        if ((uVar6 & 1) == 0) {
          this_local._7_1_ = 0;
        }
        else {
          this_local._7_1_ = 1;
        }
      }
      else {
        this_local._7_1_ = 0;
      }
    }
    else {
      this_local._7_1_ = 0;
    }
  }
  else {
    this_local._7_1_ = 1;
  }
LAB_00115966:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool StateReplayer::Impl::parse_compute_pipeline(StateCreatorInterface &iface, DatabaseInterface *resolver,
                                                 const Value &pipelines, const Value &member)
{
	Hash hash = string_to_uint64(member.GetString());
	if (replayed_compute_pipelines.count(hash))
		return true;

	auto *info_allocated = allocator.allocate_cleared<VkComputePipelineCreateInfo>();
	auto &obj = pipelines[member];
	auto &info = *info_allocated;
	info.sType = VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO;
	info.flags = obj["flags"].GetUint();
	info.basePipelineIndex = obj["basePipelineIndex"].GetInt();

	// For older captures, we might have captured these flags.
	info.flags = normalize_pipeline_creation_flags(info.flags);

	if (!parse_derived_pipeline_handle(iface, resolver, obj["basePipelineHandle"], pipelines,
	                                   RESOURCE_COMPUTE_PIPELINE, &info.basePipelineHandle))
		return false;

	if (!parse_pipeline_layout_handle(obj["layout"], &info.layout))
		return false;

	auto &stage = obj["stage"];
	info.stage.sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
	info.stage.stage = static_cast<VkShaderStageFlagBits>(stage["stage"].GetUint());
	info.stage.flags = stage["flags"].GetUint();

	if (stage.HasMember("pNext"))
		if (!parse_pnext_chain(stage["pNext"], &info.stage.pNext))
			return false;

	auto module = string_to_uint64(stage["module"].GetString());
	if (module > 0 && resolve_shader_modules)
	{
		auto module_iter = replayed_shader_modules.find(module);
		if (module_iter == replayed_shader_modules.end())
		{
			size_t external_state_size = 0;
			if (!resolver || !resolver->read_entry(RESOURCE_SHADER_MODULE, module, &external_state_size, nullptr,
			                                       PAYLOAD_READ_NO_FLAGS))
			{
				log_missing_resource("Shader module", module);
				return false;
			}

			vector<uint8_t> external_state(external_state_size);

			if (!resolver->read_entry(RESOURCE_SHADER_MODULE, module, &external_state_size, external_state.data(),
			                          PAYLOAD_READ_NO_FLAGS))
			{
				log_missing_resource("Shader module", module);
				return false;
			}

			if (!this->parse(iface, resolver, external_state.data(), external_state.size()))
				return false;

			iface.sync_shader_modules();
			module_iter = replayed_shader_modules.find(module);
			if (module_iter == replayed_shader_modules.end())
			{
				log_missing_resource("Shader module", module);
				return false;
			}
		}
		else
			iface.sync_shader_modules();
		info.stage.module = module_iter->second;
	}
	else
		info.stage.module = api_object_cast<VkShaderModule>(module);

	info.stage.pName = duplicate_string(stage["name"].GetString(), stage["name"].GetStringLength());
	if (stage.HasMember("specializationInfo"))
		if (!parse_specialization_info(stage["specializationInfo"], &info.stage.pSpecializationInfo))
			return false;

	if (obj.HasMember("pNext"))
		if (!parse_pnext_chain(obj["pNext"], &info.pNext))
			return false;

	if (!iface.enqueue_create_compute_pipeline(hash, &info, &replayed_compute_pipelines[hash]))
		return false;

	return true;
}